

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle-vulkan.c
# Opt level: O2

VkShaderModule demo_prepare_shader_module(demo *demo,void *code,size_t size)

{
  VkResult VVar1;
  VkShaderModule module;
  VkShaderModuleCreateInfo moduleCreateInfo;
  VkShaderModule local_30;
  VkShaderModuleCreateInfo local_28;
  
  local_28.sType = VK_STRUCTURE_TYPE_SHADER_MODULE_CREATE_INFO;
  local_28.pNext = (void *)0x0;
  local_28.flags = 0;
  local_28.codeSize = size;
  local_28.pCode = (uint32_t *)code;
  VVar1 = (*glad_vkCreateShaderModule)
                    (demo->device,&local_28,(VkAllocationCallbacks *)0x0,&local_30);
  if (VVar1 == VK_SUCCESS) {
    return local_30;
  }
  __assert_fail("!err",
                "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/tests/triangle-vulkan.c"
                ,0x4c4,
                "VkShaderModule demo_prepare_shader_module(struct demo *, const void *, size_t)");
}

Assistant:

static VkShaderModule
demo_prepare_shader_module(struct demo *demo, const void *code, size_t size) {
    VkShaderModuleCreateInfo moduleCreateInfo;
    VkShaderModule module;
    VkResult U_ASSERT_ONLY err;

    moduleCreateInfo.sType = VK_STRUCTURE_TYPE_SHADER_MODULE_CREATE_INFO;
    moduleCreateInfo.pNext = NULL;

    moduleCreateInfo.codeSize = size;
    moduleCreateInfo.pCode = code;
    moduleCreateInfo.flags = 0;
    err = vkCreateShaderModule(demo->device, &moduleCreateInfo, NULL, &module);
    assert(!err);

    return module;
}